

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q8_1_ref(float *x,block_q8_1 *y,int64_t k)

{
  ggml_fp16_t gVar1;
  ulong uVar2;
  ulong uVar3;
  int j;
  long lVar4;
  int8_t *piVar5;
  ulong uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar6 = 0;
  uVar2 = k / 0x20 & 0xffffffff;
  if ((int)(k / 0x20) < 1) {
    uVar2 = uVar6;
  }
  piVar5 = y->qs + 0x10;
  for (; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    uVar3 = (ulong)((uint)uVar6 & 0x7ffffff);
    fVar11 = 0.0;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      if (fVar11 <= ABS(x[uVar3 * 0x20 + lVar4])) {
        fVar11 = ABS(x[uVar3 * 0x20 + lVar4]);
      }
    }
    fVar11 = fVar11 / 127.0;
    fVar10 = (float)(-(uint)(fVar11 != 0.0) & (uint)(1.0 / fVar11));
    gVar1 = ggml_compute_fp32_to_fp16(fVar11);
    y[uVar6].field_0.field_0.d = gVar1;
    iVar7 = 0;
    for (lVar4 = -0x10; lVar4 != 0; lVar4 = lVar4 + 1) {
      fVar9 = x[uVar3 * 0x20 + lVar4 + 0x20];
      fVar8 = roundf(x[uVar3 * 0x20 + lVar4 + 0x10] * fVar10);
      piVar5[lVar4] = (char)(int)fVar8;
      fVar9 = roundf(fVar9 * fVar10);
      piVar5[lVar4 + 0x10] = (char)(int)fVar9;
      iVar7 = iVar7 + (char)(int)fVar8 + (int)(char)(int)fVar9;
    }
    gVar1 = ggml_compute_fp32_to_fp16(fVar11 * (float)iVar7);
    y[uVar6].field_0.field_0.s = gVar1;
    piVar5 = piVar5 + 0x24;
  }
  return;
}

Assistant:

void quantize_row_q8_1_ref(const float * GGML_RESTRICT x, block_q8_1 * GGML_RESTRICT y, int64_t k) {
    assert(QK8_1 == 32);
    assert(k % QK8_1 == 0);
    const int nb = k / QK8_1;

    for (int i = 0; i < nb; i++) {
        float amax = 0.0f; // absolute max

        for (int j = 0; j < QK8_1; j++) {
            const float v = x[i*QK8_1 + j];
            amax = MAX(amax, fabsf(v));
        }

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        int sum = 0;

        for (int j = 0; j < QK8_1/2; ++j) {
            const float v0 = x[i*QK8_1           + j]*id;
            const float v1 = x[i*QK8_1 + QK8_1/2 + j]*id;

            y[i].qs[          j] = roundf(v0);
            y[i].qs[QK8_1/2 + j] = roundf(v1);

            sum += y[i].qs[          j];
            sum += y[i].qs[QK8_1/2 + j];
        }

        y[i].s = GGML_FP32_TO_FP16(sum*d);
    }
}